

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.c
# Opt level: O0

void strbuf_BinarySink_write(BinarySink *bs,void *data,size_t len)

{
  void *__dest;
  strbuf *buf_o;
  size_t len_local;
  void *data_local;
  BinarySink *bs_local;
  
  __dest = strbuf_append((strbuf *)(bs + -1),len);
  memcpy(__dest,data,len);
  return;
}

Assistant:

static void strbuf_BinarySink_write(
    BinarySink *bs, const void *data, size_t len)
{
    strbuf *buf_o = BinarySink_DOWNCAST(bs, strbuf);
    memcpy(strbuf_append(buf_o, len), data, len);
}